

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolylineSegmentedPath.cpp
# Opt level: O0

void __thiscall
OpenSteer::PolylineSegmentedPath::mapPointToSegmentDistanceAndPointAndTangent
          (PolylineSegmentedPath *this,size_type segmentIndex,Vec3 *point,float *distance,
          Vec3 *pointOnPath,Vec3 *tangent)

{
  float *valueToClamp;
  const_reference pvVar1;
  const_reference maxValue;
  float *in_RCX;
  size_type in_RSI;
  long in_RDI;
  Vec3 *in_R8;
  Vec3 *in_R9;
  float fVar2;
  Vec3 VVar3;
  Vec3 segmentStartToPoint;
  Vec3 segmentStartPoint;
  Vec3 *v;
  Vec3 *in_stack_ffffffffffffff20;
  Vec3 local_c0 [4];
  Vec3 local_90;
  float local_84;
  Vec3 local_80;
  undefined8 local_70;
  float local_68;
  Vec3 local_60;
  Vec3 local_50;
  Vec3 local_40;
  Vec3 *local_30;
  Vec3 *local_28;
  float *local_20;
  size_type local_10;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_10 = in_RSI;
  pvVar1 = std::vector<OpenSteer::Vec3,_std::allocator<OpenSteer::Vec3>_>::operator[]
                     ((vector<OpenSteer::Vec3,_std::allocator<OpenSteer::Vec3>_> *)(in_RDI + 8),
                      in_RSI);
  local_40.z = pvVar1->z;
  local_40.x = pvVar1->x;
  local_40.y = pvVar1->y;
  v = &local_40;
  VVar3 = Vec3::operator-(in_stack_ffffffffffffff20,v);
  local_60.z = VVar3.z;
  local_50.z = local_60.z;
  local_60._0_8_ = VVar3._0_8_;
  local_50.x = local_60.x;
  local_50.y = local_60.y;
  local_60 = VVar3;
  pvVar1 = std::vector<OpenSteer::Vec3,_std::allocator<OpenSteer::Vec3>_>::operator[]
                     ((vector<OpenSteer::Vec3,_std::allocator<OpenSteer::Vec3>_> *)(in_RDI + 0x20),
                      local_10);
  VVar3 = Vec3::operator=(local_30,pvVar1);
  local_80.z = VVar3.z;
  local_68 = local_80.z;
  local_80._0_8_ = VVar3._0_8_;
  local_70._0_4_ = local_80.x;
  local_70._4_4_ = local_80.y;
  local_80 = VVar3;
  fVar2 = Vec3::dot(&local_50,local_30);
  valueToClamp = local_20;
  *local_20 = fVar2;
  local_84 = 0.0;
  maxValue = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)(in_RDI + 0x38),local_10);
  fVar2 = clamp<float>(valueToClamp,&local_84,maxValue);
  *local_20 = fVar2;
  Vec3::operator*(in_stack_ffffffffffffff20,(float)((ulong)v >> 0x20));
  VVar3 = Vec3::operator+(in_stack_ffffffffffffff20,v);
  local_c0[0].z = VVar3.z;
  local_90.z = local_c0[0].z;
  local_c0[0]._0_8_ = VVar3._0_8_;
  local_90.x = local_c0[0].x;
  local_90.y = local_c0[0].y;
  Vec3::operator=(local_28,&local_90);
  return;
}

Assistant:

void 
OpenSteer::PolylineSegmentedPath::mapPointToSegmentDistanceAndPointAndTangent( size_type segmentIndex,
                                                                               Vec3 const& point,
                                                                               float& distance,
                                                                               Vec3& pointOnPath,
                                                                               Vec3& tangent ) const
{
    assert( segmentIndex < segmentCount() && "segmentIndex is out of range." );
    
    Vec3 const segmentStartPoint = points_[ segmentIndex ];
    Vec3 const segmentStartToPoint( point - segmentStartPoint );
    tangent = segmentTangents_[ segmentIndex ];
    distance = segmentStartToPoint.dot( tangent );
    distance =  clamp( distance, 0.0f, segmentLengths_[ segmentIndex ] );
    pointOnPath = tangent * distance + segmentStartPoint;
}